

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O2

void * __thiscall
cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
          (MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *this,size_type userSize)

{
  BinIndexType binIndex;
  uint uVar1;
  MemChunk *pMVar2;
  undefined4 *puVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong size;
  
  uVar6 = this->m_padding + userSize;
  if (uVar6 < 0xe1) {
    size = 0x20;
    if (0xf < uVar6) {
      size = (ulong)((int)uVar6 + 0x1fU & 0x1f0);
    }
    bVar4 = (byte)(size >> 3);
    uVar5 = this->m_smallMap >> (bVar4 & 0x1f);
    if ((uVar5 & 3) == 0) {
      if (this->m_smallMap >> (bVar4 & 0x1f) == 0) goto LAB_00102868;
      uVar1 = 2 << (bVar4 & 0x1f);
      uVar5 = (-uVar1 | uVar1) & uVar5 << (bVar4 & 0x1f);
      binIndex = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> binIndex & 1) == 0; binIndex = binIndex + 1) {
        }
      }
      pMVar2 = removeSmallChunkList(this,binIndex);
      if ((pMVar2 == (MemChunk *)0x0) ||
         ((pMVar2->m_size & 0xfffffffffffffff0) != (ulong)(binIndex << 3))) goto LAB_001028b6;
      pMVar2 = splitChunk(this,pMVar2,size);
    }
    else {
      uVar5 = (uVar5 & 1 | (uint)(size >> 3)) ^ 1;
      pMVar2 = removeSmallChunkList(this,uVar5);
      if ((pMVar2 == (MemChunk *)0x0) ||
         ((pMVar2->m_size & 0xfffffffffffffff0) != (ulong)(uVar5 << 3))) {
LAB_001028b6:
        puVar3 = (undefined4 *)__cxa_allocate_exception(0x10);
        *puVar3 = 1;
        *(char **)(puVar3 + 2) = "assertion failure.";
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
    }
LAB_00102898:
    setUsed(this,pMVar2,userSize);
    pMVar2 = pMVar2 + 1;
  }
  else {
    if (uVar6 < 0xffffffffffffff80) {
      size = uVar6 + 0x1f & 0xfffffffffffffff0;
LAB_00102868:
      if (((this->m_treeMap != 0) && (pMVar2 = treeMalloc(this,size), pMVar2 != (MemChunk *)0x0)) ||
         (pMVar2 = arenaAlloc(this,size), pMVar2 != (MemChunk *)0x0)) goto LAB_00102898;
    }
    pMVar2 = (MemChunk *)0x0;
  }
  return pMVar2;
}

Assistant:

T*
    allocate (size_type userSize)
    {
        size_type  chunkSize;

        size_type allocSize = getMinAllocSize (userSize);

        if (allocSize < MIN_LARGE_REQUEST)
        {
            BinIndexType binIndex;
            BinIndexType smallBits;
            chunkSize = (allocSize < MIN_REQUEST) ? MIN_CHUNK_SIZE : calcChunkSize (allocSize);
            binIndex = getSmallBinIndex (chunkSize);
            smallBits = m_smallMap >> binIndex;

            /*
             * Check if two smallest chunk lists that can satisfy the request.
             * Note that since the chunk is quite tight, it is not necessary
             * to split the chunk since there will not be enough rooms.
             */
            if ((smallBits & 0x3U) != 0)
            {
                MemChunk* chunk;
                binIndex += ~smallBits & 1; /* Uses next bin if idx empty */

                chunk = removeSmallChunkList (binIndex);
                COOKMEM_ASSERT(chunk != nullptr && chunk->getChunkSize() == getSmallBinSize (binIndex));

                setUsed (chunk, userSize);

                return getUserPointer (chunk, userSize);
            }
            else
            {
                if (smallBits != 0)
                {
                    /* Use chunk in next nonempty smallbin */
                    MemChunk* chunk;
                    BinIndexType i;
                    BinIndexType leftbits = (smallBits << binIndex) & left_bits(idx2bit(binIndex));
                    BinIndexType leastbit = least_bit(leftbits);
                    cookmem_bit2treeIndex(leastbit, i);

                    chunk = removeSmallChunkList(i);
                    COOKMEM_ASSERT(chunk != nullptr && chunk->getChunkSize() == getSmallBinSize(i));

                    chunk = splitChunk (chunk, chunkSize);

                    setUsed (chunk, userSize);

                    return getUserPointer (chunk, userSize);
                }
            }
        }
        else if (allocSize >= MAX_REQUEST)
        {
            // The request size is too big.
            m_logger.logAllocation (nullptr, userSize);
            return nullptr;
        }
        else
        {
            chunkSize = calcChunkSize (allocSize);
        }

        MemChunk* chunk;

        /*
         * Check if we have enough space in existing chunks.
         */
        if (m_treeMap != 0)
        {
            chunk = treeMalloc (chunkSize);
        }
        else
        {
            chunk = nullptr;
        }

        /*
         * At this point, we have to allocate memory from arena.
         */
        if (chunk == nullptr)
        {
            chunk = arenaAlloc (chunkSize);

            if (chunk == nullptr)
            {
                m_logger.logAllocation (nullptr, userSize);
                return nullptr;
            }
        }

        setUsed (chunk, userSize);

        return getUserPointer (chunk, userSize);
    }